

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

void __thiscall QSslSocket::~QSslSocket(QSslSocket *this)

{
  QSslSocketPrivate *pQVar1;
  undefined8 *in_RDI;
  QSslSocketPrivate *d;
  
  *in_RDI = &PTR_metaObject_004a0500;
  pQVar1 = d_func((QSslSocket *)0x3a047a);
  if (pQVar1->plainSocket != (QTcpSocket *)0x0) {
    (**(code **)(*(long *)&pQVar1->plainSocket->super_QAbstractSocket + 0x20))();
  }
  pQVar1->plainSocket = (QTcpSocket *)0x0;
  QTcpSocket::~QTcpSocket((QTcpSocket *)0x3a04bb);
  return;
}

Assistant:

QSslSocket::~QSslSocket()
{
    Q_D(QSslSocket);
#ifdef QSSLSOCKET_DEBUG
    qCDebug(lcSsl) << "QSslSocket::~QSslSocket(), this =" << (void *)this;
#endif
    delete d->plainSocket;
    d->plainSocket = nullptr;
}